

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  char cVar5;
  BYTE *d;
  short *psVar6;
  char *pcVar7;
  long lVar8;
  long *plVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int *piVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  short *psVar20;
  long lVar21;
  ulong *puVar22;
  ulong *puVar23;
  int iVar24;
  short *psVar25;
  char *pcVar26;
  long *plVar27;
  long *plVar28;
  long lVar29;
  BYTE *e_3;
  int *piVar30;
  long *plVar31;
  int searchMatchNb;
  int iVar32;
  ulong uVar33;
  U16 *hashTable;
  char *local_70;
  
  if (acceleration < 2) {
    acceleration = 1;
  }
  iVar11 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar11 = srcSize + (uint)srcSize / 0xff + 0x10;
  }
  sVar2 = *(short *)((long)state + 0x4004);
  iVar19 = (int)dst;
  sVar4 = (short)src;
  if (dstCapacity < iVar11) {
    plVar31 = (long *)src;
    if (0x1000a < srcSize) {
      if (sVar2 == 0) {
        if (*(short *)((long)state + 0x4006) == 0) {
          if (*(int *)((long)state + 0x4000) == 0) {
            uVar12 = 0;
          }
          else {
            uVar12 = *(int *)((long)state + 0x4000) + 0x10000;
            *(uint *)((long)state + 0x4000) = uVar12;
          }
        }
        else {
          *(undefined2 *)((long)state + 0x4006) = 0;
          uVar12 = 0;
          memset(state,0,0x4004);
        }
        *(undefined8 *)((long)state + 0x4008) = 0;
        *(undefined8 *)((long)state + 0x4010) = 0;
        *(undefined4 *)((long)state + 0x4018) = 0;
      }
      else {
        uVar12 = 0;
        memset(state,0,0x4020);
      }
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      lVar29 = (long)src - (ulong)uVar12;
      pcVar7 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar12;
      *(undefined2 *)((long)state + 0x4006) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar12;
LAB_0010cb0d:
      iVar32 = 1;
      lVar21 = *(long *)((long)plVar31 + 1);
      plVar28 = (long *)((long)plVar31 + 1);
      iVar11 = acceleration << 6;
      while( true ) {
        plVar27 = (long *)((long)iVar32 + (long)plVar28);
        local_70 = dst;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar27) goto LAB_0010ce30;
        uVar17 = (ulong)(lVar21 * -0x30e4432345000000) >> 0x34;
        uVar12 = *(uint *)((long)state + uVar17 * 4);
        iVar32 = (int)plVar28;
        iVar24 = (int)lVar29;
        lVar21 = *plVar27;
        *(int *)((long)state + uVar17 * 4) = iVar32 - iVar24;
        if (((uint)(iVar32 - iVar24) <= uVar12 + 0xffff) &&
           (*(int *)(lVar29 + (ulong)uVar12) == (int)*plVar28)) break;
        iVar32 = iVar11 >> 6;
        iVar11 = iVar11 + 1;
        plVar28 = plVar27;
      }
      lVar8 = (ulong)uVar12 + lVar29;
      lVar21 = 0;
      cVar5 = (char)plVar28 * '\x10' + (char)plVar31 * -0x10;
      do {
        cVar10 = cVar5;
        lVar18 = lVar21;
        piVar30 = (int *)(lVar8 + lVar18);
        plVar27 = (long *)((long)plVar28 + lVar18);
        if ((piVar30 <= src) || (plVar27 <= plVar31)) break;
        lVar21 = lVar18 + -1;
        cVar5 = cVar10 + -0x10;
      } while (*(char *)((long)plVar28 + lVar18 + -1) == *(char *)(lVar8 + -1 + lVar18));
      uVar12 = iVar32 - (int)plVar31;
      uVar17 = (ulong)(uVar12 + (int)lVar18);
      uVar33 = (ulong)uVar12 + lVar18;
      if (pcVar7 < dst + (uVar33 & 0xffffffff) / 0xff + uVar17 + 9) {
        return 0;
      }
      if ((uint)uVar33 < 0xf) {
        plVar28 = (long *)(dst + 1);
        *dst = cVar10;
      }
      else {
        *dst = -0x10;
        plVar28 = (long *)(dst + 2);
        for (iVar11 = (iVar32 - (int)plVar31) + (int)lVar18 + -0xf; 0xfe < iVar11;
            iVar11 = iVar11 + -0xff) {
          *(char *)((long)plVar28 + -1) = -1;
          plVar28 = (long *)((long)plVar28 + 1);
        }
        *(char *)((long)plVar28 + -1) = (char)iVar11;
      }
      plVar9 = (long *)(uVar17 + (long)plVar28);
      do {
        *plVar28 = *plVar31;
        plVar28 = plVar28 + 1;
        plVar31 = plVar31 + 1;
      } while (plVar28 < plVar9);
      do {
        *(short *)plVar9 = (short)plVar27 - (short)piVar30;
        puVar1 = (ulong *)((long)plVar27 + 4);
        puVar22 = (ulong *)(piVar30 + 1);
        puVar23 = puVar1;
        if (src + ((ulong)(uint)srcSize - 0xc) <= puVar1) {
LAB_0010ccc6:
          iVar11 = ((int)puVar23 - (int)plVar27) + -4;
LAB_0010ccce:
          if (puVar23 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar22 == *puVar23) goto code_r0x0010cce2;
            uVar33 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar12 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar11;
          }
          else {
            if ((puVar23 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar22 == (short)*puVar23)
               ) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < src + ((ulong)(uint)srcSize - 5)) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar12 = (int)puVar23 - (int)puVar1;
          }
          goto LAB_0010cd0d;
        }
        if (*puVar22 == *puVar1) {
          puVar22 = (ulong *)(piVar30 + 3);
          puVar23 = (ulong *)((long)plVar27 + 0xc);
          goto LAB_0010ccc6;
        }
        uVar17 = *puVar1 ^ *puVar22;
        lVar21 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar12 = (uint)lVar21 >> 3;
LAB_0010cd0d:
        if (pcVar7 < (char *)((long)plVar9 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        local_70 = (char *)((long)plVar9 + 2);
        if (uVar12 < 0xf) {
          *dst = *dst + (char)uVar12;
        }
        else {
          *dst = *dst + '\x0f';
          local_70[0] = -1;
          local_70[1] = -1;
          local_70[2] = -1;
          local_70[3] = -1;
          lVar21 = 0;
          for (uVar13 = uVar12 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
            pcVar26 = (char *)((long)plVar9 + lVar21 + 6);
            pcVar26[0] = -1;
            pcVar26[1] = -1;
            pcVar26[2] = -1;
            pcVar26[3] = -1;
            lVar21 = lVar21 + 4;
          }
          lVar8 = lVar21 + ((ulong)uVar13 & 0xffff) / 0xff;
          local_70 = (char *)((long)plVar9 + lVar8 + 3);
          *(char *)((long)plVar9 + lVar8 + 2) =
               (char)lVar21 + (char)((uVar13 & 0xffff) / 0xff) + (char)uVar12 + -0xf;
        }
        lVar21 = (long)plVar27 + (ulong)uVar12;
        plVar31 = (long *)(lVar21 + 4);
        if (src + ((ulong)(uint)srcSize - 0xb) <= plVar31) goto LAB_0010ce30;
        *(int *)((long)state + ((ulong)(*(long *)(lVar21 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar21 + 2) - iVar24;
        uVar17 = (ulong)(*plVar31 * -0x30e4432345000000) >> 0x34;
        uVar13 = (int)plVar31 - iVar24;
        uVar12 = *(uint *)((long)state + uVar17 * 4);
        piVar30 = (int *)((ulong)uVar12 + lVar29);
        *(uint *)((long)state + uVar17 * 4) = uVar13;
        dst = local_70;
        if ((uVar12 + 0xffff < uVar13) || (*piVar30 != *(int *)plVar31)) goto LAB_0010cb0d;
        plVar9 = (long *)(local_70 + 1);
        *local_70 = '\0';
        plVar27 = plVar31;
      } while( true );
    }
    if (sVar2 != 0) {
      memset(state,0,0x4020);
      goto LAB_0010b8e4;
    }
    if (*(short *)((long)state + 0x4006) == 3) {
      uVar17 = (ulong)*(uint *)((long)state + 0x4000);
      if (0xfff < srcSize || 0xfffe < srcSize + *(uint *)((long)state + 0x4000)) goto LAB_0010c1cc;
    }
    else if (*(short *)((long)state + 0x4006) == 0) {
      uVar17 = (ulong)*(uint *)((long)state + 0x4000);
    }
    else {
LAB_0010c1cc:
      *(undefined2 *)((long)state + 0x4006) = 0;
      uVar17 = 0;
      memset(state,0,0x4004);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    uVar12 = (uint)uVar17;
    if (uVar12 == 0) {
LAB_0010b8e4:
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      pcVar7 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(int *)((long)state + 0x4000) = srcSize;
      *(undefined2 *)((long)state + 0x4006) = 3;
      piVar30 = (int *)src;
      if ((uint)srcSize < 0xd) {
LAB_0010c102:
        pcVar26 = src + ((long)srcSize - (long)piVar30);
        if ((char *)((long)dst + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1)) <= pcVar7) {
          if (pcVar26 < (char *)0xf) {
            *dst = (char)pcVar26 << 4;
          }
          else {
            *dst = -0x10;
            for (pcVar7 = pcVar26 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar7;
                pcVar7 = pcVar7 + -0xff) {
              *dst = -1;
            }
            *dst = (char)pcVar7;
          }
          memcpy((char *)((long)dst + 1),piVar30,(size_t)pcVar26);
          return ((int)(char *)((long)dst + 1) + (int)pcVar26) - iVar19;
        }
        return 0;
      }
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_0010baec:
      iVar24 = 1;
      iVar11 = *(int *)((long)piVar30 + 1);
      piVar16 = (int *)((long)piVar30 + 1);
      iVar32 = acceleration << 6;
      do {
        piVar15 = piVar16;
        piVar16 = (int *)((long)iVar24 + (long)piVar15);
        if (src + (long)srcSize + -0xb < piVar16) goto LAB_0010c102;
        iVar24 = iVar32 >> 6;
        iVar32 = iVar32 + 1;
        uVar33 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
        uVar17 = (ulong)*(ushort *)((long)state + uVar33 * 2);
        iVar11 = *piVar16;
        *(short *)((long)state + uVar33 * 2) = (short)piVar15 - sVar4;
      } while (*(int *)(src + uVar17) != *piVar15);
      lVar29 = 0;
      cVar5 = (char)piVar15 * '\x10' + (char)piVar30 * -0x10;
      do {
        cVar10 = cVar5;
        lVar21 = lVar29;
        pcVar26 = src + lVar21 + uVar17;
        piVar16 = (int *)((long)piVar15 + lVar21);
        if ((pcVar26 <= src) || (piVar16 <= piVar30)) break;
        lVar29 = lVar21 + -1;
        cVar5 = cVar10 + -0x10;
      } while (*(char *)((long)piVar15 + lVar21 + -1) == src[lVar21 + (uVar17 - 1)]);
      uVar12 = (int)piVar15 - (int)piVar30;
      uVar33 = (ulong)(uVar12 + (int)lVar21);
      uVar17 = (ulong)uVar12 + lVar21;
      if (pcVar7 < (char *)((long)dst + (uVar17 & 0xffffffff) / 0xff + uVar33 + 9)) {
        return 0;
      }
      if ((uint)uVar17 < 0xf) {
        psVar6 = (short *)((long)dst + 1);
        *dst = cVar10;
      }
      else {
        *dst = -0x10;
        psVar6 = (short *)((long)dst + 2);
        for (iVar11 = ((int)piVar15 - (int)piVar30) + (int)lVar21 + -0xf; 0xfe < iVar11;
            iVar11 = iVar11 + -0xff) {
          *(char *)((long)psVar6 + -1) = -1;
          psVar6 = (short *)((long)psVar6 + 1);
        }
        *(char *)((long)psVar6 + -1) = (char)iVar11;
      }
      psVar25 = (short *)(uVar33 + (long)psVar6);
      do {
        *(undefined8 *)psVar6 = *(undefined8 *)piVar30;
        psVar6 = psVar6 + 4;
        piVar30 = piVar30 + 2;
        psVar20 = (short *)dst;
      } while (psVar6 < psVar25);
      do {
        *psVar25 = (short)piVar16 - (short)pcVar26;
        puVar1 = (ulong *)(piVar16 + 1);
        puVar22 = (ulong *)(pcVar26 + 4);
        puVar23 = puVar1;
        if (src + (long)srcSize + -0xc <= puVar1) {
LAB_0010bc88:
          iVar11 = ((int)puVar23 - (int)piVar16) + -4;
LAB_0010bc90:
          if (puVar23 < src + (long)srcSize + -0xc) {
            if (*puVar22 == *puVar23) goto code_r0x0010bca4;
            uVar33 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar12 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar11;
          }
          else {
            if ((puVar23 < src + (long)srcSize + -8) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < src + (long)srcSize + -6) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < src + (long)srcSize + -5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar12 = (int)puVar23 - (int)puVar1;
          }
          goto LAB_0010bcc9;
        }
        if (*puVar22 == *puVar1) {
          puVar22 = (ulong *)(pcVar26 + 0xc);
          puVar23 = (ulong *)(piVar16 + 3);
          goto LAB_0010bc88;
        }
        uVar17 = *puVar1 ^ *puVar22;
        lVar29 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
        uVar12 = (uint)lVar29 >> 3;
LAB_0010bcc9:
        if (pcVar7 < (char *)((long)psVar25 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dst = (char *)(psVar25 + 1);
        if (uVar12 < 0xf) {
          *(char *)psVar20 = (char)*psVar20 + (char)uVar12;
        }
        else {
          *(char *)psVar20 = (char)*psVar20 + '\x0f';
          *(short *)((long)dst + 0) = -1;
          *(short *)((long)dst + 2) = -1;
          lVar29 = 0;
          for (uVar13 = uVar12 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
            pcVar26 = (char *)((long)psVar25 + lVar29 + 6);
            pcVar26[0] = -1;
            pcVar26[1] = -1;
            pcVar26[2] = -1;
            pcVar26[3] = -1;
            lVar29 = lVar29 + 4;
          }
          lVar21 = lVar29 + ((ulong)uVar13 & 0xffff) / 0xff;
          dst = (char *)((long)psVar25 + lVar21 + 3);
          *(char *)((long)psVar25 + lVar21 + 2) =
               (char)lVar29 + (char)((uVar13 & 0xffff) / 0xff) + (char)uVar12 + -0xf;
        }
        lVar29 = (long)piVar16 + (ulong)uVar12;
        piVar30 = (int *)(lVar29 + 4);
        if (src + (long)srcSize + -0xb <= piVar30) goto LAB_0010c102;
        *(short *)((long)state + (ulong)((uint)(*(int *)(lVar29 + 2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)lVar29 + 2) - sVar4;
        uVar17 = (ulong)((uint)(*piVar30 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        pcVar26 = src + uVar3;
        *(short *)((long)state + uVar17 * 2) = (short)piVar30 - sVar4;
        if (*(int *)(src + uVar3) != *piVar30) goto LAB_0010baec;
        psVar25 = (short *)((long)dst + 1);
        *dst = '\0';
        psVar20 = (short *)dst;
        piVar16 = piVar30;
      } while( true );
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    pcVar7 = dst + dstCapacity;
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar12;
    *(undefined2 *)((long)state + 0x4006) = 3;
    local_70 = dst;
    if (0xc < (uint)srcSize) {
      lVar29 = (long)src - uVar17;
      *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
           (short)uVar17;
LAB_0010c379:
      iVar24 = 1;
      iVar11 = *(int *)((long)plVar31 + 1);
      plVar28 = (long *)((long)plVar31 + 1);
      iVar32 = acceleration << 6;
      while( true ) {
        plVar27 = (long *)((long)iVar24 + (long)plVar28);
        if (src + (long)srcSize + -0xb < plVar27) goto LAB_0010c9ec;
        uVar17 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        sVar2 = (short)lVar29;
        iVar11 = (int)*plVar27;
        *(short *)((long)state + uVar17 * 2) = (short)plVar28 - sVar2;
        if ((uVar12 <= uVar3) && (*(int *)(lVar29 + (ulong)uVar3) == (int)*plVar28)) break;
        iVar24 = iVar32 >> 6;
        iVar32 = iVar32 + 1;
        plVar28 = plVar27;
      }
      lVar8 = (ulong)uVar3 + lVar29;
      lVar21 = 0;
      cVar5 = (char)plVar28 * '\x10' + (char)plVar31 * -0x10;
      do {
        cVar10 = cVar5;
        lVar18 = lVar21;
        piVar30 = (int *)(lVar8 + lVar18);
        plVar27 = (long *)((long)plVar28 + lVar18);
        if ((piVar30 <= src) || (plVar27 <= plVar31)) break;
        lVar21 = lVar18 + -1;
        cVar5 = cVar10 + -0x10;
      } while (*(char *)((long)plVar28 + lVar18 + -1) == *(char *)(lVar8 + -1 + lVar18));
      uVar13 = (int)plVar28 - (int)plVar31;
      uVar33 = (ulong)(uVar13 + (int)lVar18);
      uVar17 = (ulong)uVar13 + lVar18;
      if (pcVar7 < local_70 + (uVar17 & 0xffffffff) / 0xff + uVar33 + 9) {
        return 0;
      }
      if ((uint)uVar17 < 0xf) {
        plVar9 = (long *)(local_70 + 1);
        *local_70 = cVar10;
      }
      else {
        *local_70 = -0x10;
        plVar9 = (long *)(local_70 + 2);
        for (iVar11 = ((int)plVar28 - (int)plVar31) + (int)lVar18 + -0xf; 0xfe < iVar11;
            iVar11 = iVar11 + -0xff) {
          *(char *)((long)plVar9 + -1) = -1;
          plVar9 = (long *)((long)plVar9 + 1);
        }
        *(char *)((long)plVar9 + -1) = (char)iVar11;
      }
      plVar28 = (long *)(uVar33 + (long)plVar9);
      do {
        *plVar9 = *plVar31;
        plVar9 = plVar9 + 1;
        plVar31 = plVar31 + 1;
        pcVar26 = local_70;
      } while (plVar9 < plVar28);
      do {
        *(short *)plVar28 = (short)plVar27 - (short)piVar30;
        puVar1 = (ulong *)((long)plVar27 + 4);
        puVar22 = (ulong *)(piVar30 + 1);
        puVar23 = puVar1;
        if (src + (long)srcSize + -0xc <= puVar1) {
LAB_0010c530:
          iVar11 = ((int)puVar23 - (int)plVar27) + -4;
LAB_0010c538:
          if (puVar23 < src + (long)srcSize + -0xc) {
            if (*puVar22 == *puVar23) goto code_r0x0010c54c;
            uVar33 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar13 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar11;
          }
          else {
            if ((puVar23 < src + (long)srcSize + -8) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < src + (long)srcSize + -6) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < src + (long)srcSize + -5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar13 = (int)puVar23 - (int)puVar1;
          }
          goto LAB_0010c577;
        }
        if (*puVar22 == *puVar1) {
          puVar22 = (ulong *)(piVar30 + 3);
          puVar23 = (ulong *)((long)plVar27 + 0xc);
          goto LAB_0010c530;
        }
        uVar17 = *puVar1 ^ *puVar22;
        lVar21 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar13 = (uint)lVar21 >> 3;
LAB_0010c577:
        if (pcVar7 < (char *)((long)plVar28 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        local_70 = (char *)((long)plVar28 + 2);
        if (uVar13 < 0xf) {
          *pcVar26 = *pcVar26 + (char)uVar13;
        }
        else {
          *pcVar26 = *pcVar26 + '\x0f';
          local_70[0] = -1;
          local_70[1] = -1;
          local_70[2] = -1;
          local_70[3] = -1;
          lVar21 = 0;
          for (uVar14 = uVar13 - 0xf; 0x3fb < uVar14; uVar14 = uVar14 - 0x3fc) {
            pcVar26 = (char *)((long)plVar28 + lVar21 + 6);
            pcVar26[0] = -1;
            pcVar26[1] = -1;
            pcVar26[2] = -1;
            pcVar26[3] = -1;
            lVar21 = lVar21 + 4;
          }
          lVar8 = lVar21 + ((ulong)uVar14 & 0xffff) / 0xff;
          local_70 = (char *)((long)plVar28 + lVar8 + 3);
          *(char *)((long)plVar28 + lVar8 + 2) =
               (char)lVar21 + (char)((uVar14 & 0xffff) / 0xff) + (char)uVar13 + -0xf;
        }
        lVar21 = (long)plVar27 + (ulong)uVar13;
        plVar31 = (long *)(lVar21 + 4);
        if (src + (long)srcSize + -0xb <= plVar31) break;
        *(short *)((long)state + (ulong)((uint)(*(int *)(lVar21 + 2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)lVar21 + 2) - sVar2;
        uVar17 = (ulong)((uint)(*(int *)plVar31 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        piVar30 = (int *)((ulong)uVar3 + lVar29);
        *(short *)((long)state + uVar17 * 2) = (short)plVar31 - sVar2;
        if ((uVar3 < uVar12) || (*piVar30 != *(int *)plVar31)) goto LAB_0010c379;
        plVar28 = (long *)(local_70 + 1);
        *local_70 = '\0';
        plVar27 = plVar31;
        pcVar26 = local_70;
      } while( true );
    }
LAB_0010c9ec:
    pcVar26 = src + ((long)srcSize - (long)plVar31);
    if (pcVar7 < local_70 + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1)) {
      return 0;
    }
    if (pcVar26 < (char *)0xf) {
      *local_70 = (char)pcVar26 << 4;
    }
    else {
      *local_70 = -0x10;
      for (pcVar7 = pcVar26 + -0xf; local_70 = local_70 + 1, (char *)0xfe < pcVar7;
          pcVar7 = pcVar7 + -0xff) {
        *local_70 = -1;
      }
      *local_70 = (char)pcVar7;
    }
LAB_0010ceb7:
    memcpy(local_70 + 1,plVar31,(size_t)pcVar26);
    return ((int)(local_70 + 1) + (int)pcVar26) - iVar19;
  }
  if (0x1000a < srcSize) {
    if (sVar2 == 0) {
      if (*(short *)((long)state + 0x4006) == 0) {
        if (*(int *)((long)state + 0x4000) == 0) {
          uVar17 = 0;
        }
        else {
          uVar12 = *(int *)((long)state + 0x4000) + 0x10000;
          uVar17 = (ulong)uVar12;
          *(uint *)((long)state + 0x4000) = uVar12;
        }
      }
      else {
        *(undefined2 *)((long)state + 0x4006) = 0;
        uVar17 = 0;
        memset(state,0,0x4004);
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
    }
    else {
      uVar17 = 0;
      memset(state,0,0x4020);
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    lVar29 = (long)src - uVar17;
    *(int *)((long)state + 0x4018) = srcSize;
    *(int *)((long)state + 0x4000) = srcSize + (int)uVar17;
    *(undefined2 *)((long)state + 0x4006) = 2;
    *(int *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = (int)uVar17;
    plVar31 = (long *)src;
    pcVar7 = dst;
LAB_0010cf74:
    lVar21 = *(long *)((long)plVar31 + 1);
    iVar11 = 1;
    plVar28 = (long *)((long)plVar31 + 1);
    iVar32 = acceleration << 6;
    while( true ) {
      plVar9 = (long *)((long)iVar11 + (long)plVar28);
      plVar27 = plVar31;
      dst = pcVar7;
      if (src + ((ulong)(uint)srcSize - 0xb) < plVar9) goto LAB_0010d224;
      uVar17 = (ulong)(lVar21 * -0x30e4432345000000) >> 0x34;
      uVar12 = *(uint *)((long)state + uVar17 * 4);
      iVar11 = (int)plVar28;
      iVar24 = (int)lVar29;
      lVar21 = *plVar9;
      *(int *)((long)state + uVar17 * 4) = iVar11 - iVar24;
      if (((uint)(iVar11 - iVar24) <= uVar12 + 0xffff) &&
         (*(int *)(lVar29 + (ulong)uVar12) == (int)*plVar28)) break;
      iVar11 = iVar32 >> 6;
      iVar32 = iVar32 + 1;
      plVar28 = plVar9;
    }
    lVar8 = (ulong)uVar12 + lVar29;
    iVar32 = (int)plVar31;
    lVar21 = 0;
    cVar5 = (char)plVar28 * '\x10' + (char)plVar31 * -0x10;
    do {
      cVar10 = cVar5;
      lVar18 = lVar21;
      piVar30 = (int *)(lVar8 + lVar18);
      plVar27 = (long *)((long)plVar28 + lVar18);
      if ((piVar30 <= src) || (plVar27 <= plVar31)) break;
      lVar21 = lVar18 + -1;
      cVar5 = cVar10 + -0x10;
    } while (*(char *)((long)plVar28 + lVar18 + -1) == *(char *)(lVar8 + -1 + lVar18));
    if ((uint)((iVar11 - iVar32) + (int)lVar18) < 0xf) {
      plVar28 = (long *)(pcVar7 + 1);
      *pcVar7 = cVar10;
    }
    else {
      *pcVar7 = -0x10;
      plVar28 = (long *)(pcVar7 + 2);
      for (iVar11 = (iVar11 - iVar32) + (int)lVar18 + -0xf; 0xfe < iVar11; iVar11 = iVar11 + -0xff)
      {
        *(char *)((long)plVar28 + -1) = -1;
        plVar28 = (long *)((long)plVar28 + 1);
      }
      *(char *)((long)plVar28 + -1) = (char)iVar11;
    }
    plVar9 = (long *)((ulong)(uint)((int)plVar27 - iVar32) + (long)plVar28);
    do {
      *plVar28 = *plVar31;
      plVar28 = plVar28 + 1;
      plVar31 = plVar31 + 1;
    } while (plVar28 < plVar9);
    do {
      *(short *)plVar9 = (short)plVar27 - (short)piVar30;
      dst = (char *)((long)plVar9 + 2);
      puVar1 = (ulong *)((long)plVar27 + 4);
      puVar22 = (ulong *)(piVar30 + 1);
      puVar23 = puVar1;
      if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
        if (*puVar22 == *puVar1) {
          puVar22 = (ulong *)(piVar30 + 3);
          puVar23 = (ulong *)((long)plVar27 + 0xc);
          goto LAB_0010d0a7;
        }
        uVar33 = *puVar1 ^ *puVar22;
        uVar17 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar17 = uVar17 >> 3 & 0x1fffffff;
        plVar31 = (long *)((long)plVar27 + uVar17 + 4);
LAB_0010d123:
        *pcVar7 = *pcVar7 + (char)uVar17;
        plVar27 = plVar31;
      }
      else {
LAB_0010d0a7:
        if (puVar23 < src + ((ulong)(uint)srcSize - 0xc)) {
          if (*puVar22 == *puVar23) goto code_r0x0010d0bb;
          uVar33 = *puVar23 ^ *puVar22;
          uVar17 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          puVar23 = (ulong *)((long)puVar23 + (uVar17 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar23 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar22 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar23 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar22 == (short)*puVar23))
          {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar23 < src + ((ulong)(uint)srcSize - 5)) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
          }
        }
        uVar17 = (long)puVar23 - (long)puVar1;
        plVar31 = (long *)((long)plVar27 + (uVar17 & 0xffffffff) + 4);
        if ((uint)uVar17 < 0xf) goto LAB_0010d123;
        *pcVar7 = *pcVar7 + '\x0f';
        dst[0] = -1;
        dst[1] = -1;
        dst[2] = -1;
        dst[3] = -1;
        lVar21 = 0;
        for (uVar12 = (uint)uVar17 - 0xf; 0x3fb < uVar12; uVar12 = uVar12 - 0x3fc) {
          pcVar7 = (char *)((long)plVar9 + lVar21 + 6);
          pcVar7[0] = -1;
          pcVar7[1] = -1;
          pcVar7[2] = -1;
          pcVar7[3] = -1;
          lVar21 = lVar21 + 4;
        }
        lVar8 = lVar21 + (ulong)(uVar12 & 0xffff) / 0xff;
        dst = (char *)((long)plVar9 + lVar8 + 3);
        *(char *)((long)plVar9 + lVar8 + 2) =
             (char)lVar21 + (char)((ushort)uVar12 / 0xff) + ((char)puVar23 - (char)plVar27) + -0x13;
        plVar27 = plVar31;
      }
      if (src + ((ulong)(uint)srcSize - 0xb) <= plVar27) goto LAB_0010d224;
      *(int *)((long)state +
              ((ulong)(*(long *)((long)plVar27 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar27 + -2) - iVar24;
      uVar17 = (ulong)(*plVar27 * -0x30e4432345000000) >> 0x34;
      uVar13 = (int)plVar27 - iVar24;
      uVar12 = *(uint *)((long)state + uVar17 * 4);
      piVar30 = (int *)((ulong)uVar12 + lVar29);
      *(uint *)((long)state + uVar17 * 4) = uVar13;
      plVar31 = plVar27;
      pcVar7 = dst;
      if ((uVar12 + 0xffff < uVar13) || (*piVar30 != (int)*plVar27)) goto LAB_0010cf74;
      plVar9 = (long *)(dst + 1);
      *dst = '\0';
    } while( true );
  }
  plVar27 = (long *)src;
  if (sVar2 == 0) {
    if (*(short *)((long)state + 0x4006) == 3) {
      uVar17 = (ulong)*(uint *)((long)state + 0x4000);
      if (0xfff < srcSize || 0xfffe < srcSize + *(uint *)((long)state + 0x4000)) goto LAB_0010c26b;
    }
    else if (*(short *)((long)state + 0x4006) == 0) {
      uVar17 = (ulong)*(uint *)((long)state + 0x4000);
    }
    else {
LAB_0010c26b:
      *(undefined2 *)((long)state + 0x4006) = 0;
      uVar17 = 0;
      memset(state,0,0x4004);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    uVar12 = (uint)uVar17;
    if (uVar12 == 0) goto LAB_0010b953;
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar12;
    *(undefined2 *)((long)state + 0x4006) = 3;
    if (0xc < (uint)srcSize) {
      lVar29 = (long)src - uVar17;
      *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
           (short)uVar17;
      pcVar7 = dst;
LAB_0010c6e9:
      iVar24 = 1;
      iVar11 = *(int *)((long)plVar27 + 1);
      plVar31 = (long *)((long)plVar27 + 1);
      iVar32 = acceleration << 6;
      while( true ) {
        plVar28 = (long *)((long)iVar24 + (long)plVar31);
        dst = pcVar7;
        if (src + (long)srcSize + -0xb < plVar28) goto LAB_0010c99a;
        uVar17 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        sVar2 = (short)lVar29;
        iVar11 = (int)*plVar28;
        *(short *)((long)state + uVar17 * 2) = (short)plVar31 - sVar2;
        if ((uVar12 <= uVar3) && (*(int *)(lVar29 + (ulong)uVar3) == (int)*plVar31)) break;
        iVar24 = iVar32 >> 6;
        iVar32 = iVar32 + 1;
        plVar31 = plVar28;
      }
      lVar8 = (ulong)uVar3 + lVar29;
      iVar11 = (int)plVar27;
      lVar21 = 0;
      cVar5 = (char)plVar31 * '\x10' + (char)plVar27 * -0x10;
      do {
        cVar10 = cVar5;
        lVar18 = lVar21;
        piVar30 = (int *)(lVar8 + lVar18);
        plVar28 = (long *)((long)plVar31 + lVar18);
        if ((piVar30 <= src) || (plVar28 <= plVar27)) break;
        lVar21 = lVar18 + -1;
        cVar5 = cVar10 + -0x10;
      } while (*(char *)((long)plVar31 + lVar18 + -1) == *(char *)(lVar8 + -1 + lVar18));
      if ((uint)(((int)plVar31 - iVar11) + (int)lVar18) < 0xf) {
        plVar9 = (long *)(pcVar7 + 1);
        *pcVar7 = cVar10;
      }
      else {
        *pcVar7 = -0x10;
        plVar9 = (long *)(pcVar7 + 2);
        for (iVar32 = ((int)plVar31 - iVar11) + (int)lVar18 + -0xf; 0xfe < iVar32;
            iVar32 = iVar32 + -0xff) {
          *(char *)((long)plVar9 + -1) = -1;
          plVar9 = (long *)((long)plVar9 + 1);
        }
        *(char *)((long)plVar9 + -1) = (char)iVar32;
      }
      plVar31 = (long *)((ulong)(uint)((int)plVar28 - iVar11) + (long)plVar9);
      do {
        *plVar9 = *plVar27;
        plVar9 = plVar9 + 1;
        plVar27 = plVar27 + 1;
      } while (plVar9 < plVar31);
      do {
        *(short *)plVar31 = (short)plVar28 - (short)piVar30;
        dst = (char *)((long)plVar31 + 2);
        puVar1 = (ulong *)((long)plVar28 + 4);
        puVar22 = (ulong *)(piVar30 + 1);
        puVar23 = puVar1;
        if (puVar1 < src + (long)srcSize + -0xc) {
          if (*puVar22 == *puVar1) {
            puVar22 = (ulong *)(piVar30 + 3);
            puVar23 = (ulong *)((long)plVar28 + 0xc);
            goto LAB_0010c81f;
          }
          uVar33 = *puVar1 ^ *puVar22;
          uVar17 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar17 = uVar17 >> 3 & 0x1fffffff;
          plVar27 = (long *)((long)plVar28 + uVar17 + 4);
LAB_0010c89b:
          *pcVar7 = *pcVar7 + (char)uVar17;
        }
        else {
LAB_0010c81f:
          if (puVar23 < src + (long)srcSize + -0xc) {
            if (*puVar22 == *puVar23) goto code_r0x0010c833;
            uVar33 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            puVar23 = (ulong *)((long)puVar23 + (uVar17 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar23 < src + (long)srcSize + -8) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < src + (long)srcSize + -6) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < src + (long)srcSize + -5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
          }
          uVar17 = (long)puVar23 - (long)puVar1;
          plVar27 = (long *)((long)plVar28 + (uVar17 & 0xffffffff) + 4);
          if ((uint)uVar17 < 0xf) goto LAB_0010c89b;
          *pcVar7 = *pcVar7 + '\x0f';
          dst[0] = -1;
          dst[1] = -1;
          dst[2] = -1;
          dst[3] = -1;
          lVar21 = 0;
          for (uVar13 = (uint)uVar17 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
            pcVar7 = (char *)((long)plVar31 + lVar21 + 6);
            pcVar7[0] = -1;
            pcVar7[1] = -1;
            pcVar7[2] = -1;
            pcVar7[3] = -1;
            lVar21 = lVar21 + 4;
          }
          lVar8 = lVar21 + (ulong)(uVar13 & 0xffff) / 0xff;
          dst = (char *)((long)plVar31 + lVar8 + 3);
          *(char *)((long)plVar31 + lVar8 + 2) =
               (char)lVar21 +
               (char)((ushort)uVar13 / 0xff) + ((char)puVar23 - (char)plVar28) + -0x13;
        }
        if (src + (long)srcSize + -0xb <= plVar27) break;
        *(short *)((long)state +
                  (ulong)((uint)(*(int *)((long)plVar27 + -2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)plVar27 + -2) - sVar2;
        uVar17 = (ulong)((uint)((int)*plVar27 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        piVar30 = (int *)((ulong)uVar3 + lVar29);
        *(short *)((long)state + uVar17 * 2) = (short)plVar27 - sVar2;
        pcVar7 = dst;
        if ((uVar3 < uVar12) || (*piVar30 != (int)*plVar27)) goto LAB_0010c6e9;
        plVar31 = (long *)(dst + 1);
        *dst = '\0';
        plVar28 = plVar27;
      } while( true );
    }
LAB_0010c99a:
    pcVar7 = src + ((long)srcSize - (long)plVar27);
    if ((char *)0xe < pcVar7) {
      *dst = -0x10;
      for (pcVar26 = pcVar7 + -0xf; dst = dst + 1, (char *)0xfe < pcVar26; pcVar26 = pcVar26 + -0xff
          ) {
        *dst = -1;
      }
      goto LAB_0010c9cf;
    }
  }
  else {
    memset(state,0,0x4020);
LAB_0010b953:
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    *(int *)((long)state + 0x4018) = srcSize;
    *(int *)((long)state + 0x4000) = srcSize;
    *(undefined2 *)((long)state + 0x4006) = 3;
    if (0xc < (uint)srcSize) {
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_0010be22:
      iVar11 = *(int *)((long)plVar27 + 1);
      plVar31 = (long *)((long)plVar27 + 1);
      iVar32 = acceleration << 6;
      iVar24 = 1;
      do {
        plVar28 = plVar31;
        plVar31 = (long *)((long)iVar24 + (long)plVar28);
        if (src + (long)srcSize + -0xb < plVar31) goto LAB_0010c0c5;
        iVar24 = iVar32 >> 6;
        iVar32 = iVar32 + 1;
        uVar33 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x13);
        uVar17 = (ulong)*(ushort *)((long)state + uVar33 * 2);
        iVar11 = (int)*plVar31;
        *(short *)((long)state + uVar33 * 2) = (short)plVar28 - sVar4;
      } while (*(int *)(src + uVar17) != (int)*plVar28);
      iVar11 = (int)plVar27;
      lVar29 = 0;
      cVar5 = (char)plVar28 * '\x10' + (char)plVar27 * -0x10;
      do {
        cVar10 = cVar5;
        lVar21 = lVar29;
        pcVar7 = src + lVar21 + uVar17;
        plVar31 = (long *)((long)plVar28 + lVar21);
        if ((pcVar7 <= src) || (plVar31 <= plVar27)) break;
        lVar29 = lVar21 + -1;
        cVar5 = cVar10 + -0x10;
      } while (*(char *)((long)plVar28 + lVar21 + -1) == src[lVar21 + (uVar17 - 1)]);
      if ((uint)(((int)plVar28 - iVar11) + (int)lVar21) < 0xf) {
        plVar9 = (long *)(dst + 1);
        *dst = cVar10;
      }
      else {
        *dst = -0x10;
        plVar9 = (long *)(dst + 2);
        for (iVar32 = ((int)plVar28 - iVar11) + (int)lVar21 + -0xf; 0xfe < iVar32;
            iVar32 = iVar32 + -0xff) {
          *(char *)((long)plVar9 + -1) = -1;
          plVar9 = (long *)((long)plVar9 + 1);
        }
        *(char *)((long)plVar9 + -1) = (char)iVar32;
      }
      plVar28 = (long *)((ulong)(uint)((int)plVar31 - iVar11) + (long)plVar9);
      do {
        *plVar9 = *plVar27;
        plVar9 = plVar9 + 1;
        plVar27 = plVar27 + 1;
        pcVar26 = dst;
      } while (plVar9 < plVar28);
      do {
        *(short *)plVar28 = (short)plVar31 - (short)pcVar7;
        dst = (char *)((long)plVar28 + 2);
        puVar1 = (ulong *)((long)plVar31 + 4);
        puVar22 = (ulong *)(pcVar7 + 4);
        puVar23 = puVar1;
        if (puVar1 < src + (long)srcSize + -0xc) {
          if (*puVar22 == *puVar1) {
            puVar22 = (ulong *)(pcVar7 + 0xc);
            puVar23 = (ulong *)((long)plVar31 + 0xc);
            goto LAB_0010bfaa;
          }
          uVar33 = *puVar1 ^ *puVar22;
          uVar17 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar17 = uVar17 >> 3 & 0x1fffffff;
          plVar27 = (long *)((long)plVar31 + uVar17 + 4);
LAB_0010c027:
          *pcVar26 = *pcVar26 + (char)uVar17;
        }
        else {
LAB_0010bfaa:
          if (puVar23 < src + (long)srcSize + -0xc) {
            if (*puVar22 == *puVar23) goto code_r0x0010bfba;
            uVar33 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            puVar23 = (ulong *)((long)puVar23 + (uVar17 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar23 < src + (long)srcSize + -8) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < src + (long)srcSize + -6) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < src + (long)srcSize + -5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
          }
          uVar17 = (long)puVar23 - (long)puVar1;
          plVar27 = (long *)((long)plVar31 + (uVar17 & 0xffffffff) + 4);
          if ((uint)uVar17 < 0xf) goto LAB_0010c027;
          *pcVar26 = *pcVar26 + '\x0f';
          dst[0] = -1;
          dst[1] = -1;
          dst[2] = -1;
          dst[3] = -1;
          lVar29 = 0;
          for (uVar12 = (uint)uVar17 - 0xf; 0x3fb < uVar12; uVar12 = uVar12 - 0x3fc) {
            pcVar7 = (char *)((long)plVar28 + lVar29 + 6);
            pcVar7[0] = -1;
            pcVar7[1] = -1;
            pcVar7[2] = -1;
            pcVar7[3] = -1;
            lVar29 = lVar29 + 4;
          }
          lVar21 = lVar29 + (ulong)(uVar12 & 0xffff) / 0xff;
          dst = (char *)((long)plVar28 + lVar21 + 3);
          *(char *)((long)plVar28 + lVar21 + 2) =
               (char)lVar29 +
               (char)((ushort)uVar12 / 0xff) + ((char)puVar23 - (char)plVar31) + -0x13;
        }
        if (src + (long)srcSize + -0xb <= plVar27) break;
        *(short *)((long)state +
                  (ulong)((uint)(*(int *)((long)plVar27 + -2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)plVar27 + -2) - sVar4;
        uVar17 = (ulong)((uint)((int)*plVar27 * -0x61c8864f) >> 0x13);
        uVar3 = *(ushort *)((long)state + uVar17 * 2);
        pcVar7 = src + uVar3;
        *(short *)((long)state + uVar17 * 2) = (short)plVar27 - sVar4;
        if (*(int *)(src + uVar3) != (int)*plVar27) goto LAB_0010be22;
        plVar28 = (long *)(dst + 1);
        *dst = '\0';
        plVar31 = plVar27;
        pcVar26 = dst;
      } while( true );
    }
LAB_0010c0c5:
    pcVar7 = src + ((long)srcSize - (long)plVar27);
    if ((char *)0xe < pcVar7) {
      *dst = -0x10;
      for (pcVar26 = pcVar7 + -0xf; dst = dst + 1, (char *)0xfe < pcVar26; pcVar26 = pcVar26 + -0xff
          ) {
        *dst = -1;
      }
LAB_0010c9cf:
      *dst = (char)pcVar26;
      goto LAB_0010d271;
    }
  }
  *dst = (char)pcVar7 << 4;
LAB_0010d271:
  memcpy(dst + 1,plVar27,(size_t)pcVar7);
  return ((int)(dst + 1) + (int)pcVar7) - iVar19;
code_r0x0010cce2:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar11 = iVar11 + 8;
  goto LAB_0010ccce;
LAB_0010ce30:
  pcVar26 = src + ((ulong)(uint)srcSize - (long)plVar31);
  if (pcVar7 < local_70 + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar26 < (char *)0xf) {
    *local_70 = (char)pcVar26 << 4;
  }
  else {
    *local_70 = -0x10;
    for (pcVar7 = pcVar26 + -0xf; local_70 = local_70 + 1, (char *)0xfe < pcVar7;
        pcVar7 = pcVar7 + -0xff) {
      *local_70 = -1;
    }
    *local_70 = (char)pcVar7;
  }
  goto LAB_0010ceb7;
code_r0x0010c54c:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar11 = iVar11 + 8;
  goto LAB_0010c538;
code_r0x0010bca4:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar11 = iVar11 + 8;
  goto LAB_0010bc90;
code_r0x0010d0bb:
  puVar22 = puVar22 + 1;
  puVar23 = puVar23 + 1;
  goto LAB_0010d0a7;
LAB_0010d224:
  pcVar7 = src + ((ulong)(uint)srcSize - (long)plVar27);
  if (pcVar7 < (char *)0xf) {
    *dst = (char)pcVar7 << 4;
  }
  else {
    *dst = -0x10;
    for (pcVar26 = pcVar7 + -0xf; dst = dst + 1, (char *)0xfe < pcVar26; pcVar26 = pcVar26 + -0xff)
    {
      *dst = -1;
    }
    *dst = (char)pcVar26;
  }
  goto LAB_0010d271;
code_r0x0010c833:
  puVar22 = puVar22 + 1;
  puVar23 = puVar23 + 1;
  goto LAB_0010c81f;
code_r0x0010bfba:
  puVar22 = puVar22 + 1;
  puVar23 = puVar23 + 1;
  goto LAB_0010bfaa;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}